

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  Mat *this_01;
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint _h;
  int *piVar15;
  void *pvVar16;
  Allocator *pAVar17;
  size_t sVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  int iVar25;
  Layer *pLVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  undefined1 (*pauVar33) [64];
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  undefined4 *puVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  _func_int **pp_Var52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  long local_158;
  long local_150;
  ParamDict pd;
  size_t local_e8;
  Allocator *local_d8;
  int local_cc;
  long local_b0;
  long local_a8;
  long local_a0;
  
  pLVar26 = create_layer_cpu(0xe);
  this->flatten = pLVar26;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar24 = cpu_support_x86_f16c();
  if ((iVar24 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  iVar24 = (this->super_InnerProduct).weight_data_size;
  _h = (this->super_InnerProduct).num_output;
  uVar51 = (ulong)(int)_h;
  iVar25 = iVar24 / (int)_h;
  this_00 = &(this->super_InnerProduct).weight_data;
  if (opt->use_packing_layout == true) {
    this_01 = &this->weight_data_tm;
    if ((uVar51 & 0xf) == 0) {
      Mat::reshape((Mat *)&pd,this_00,iVar25,_h,(Allocator *)0x0);
      Mat::create(this_01,iVar25,(int)_h >> 4,0x40,0x10,(Allocator *)0x0);
      lVar27 = 3;
      lVar28 = 4;
      lVar30 = 5;
      lVar35 = 6;
      lVar31 = 7;
      lVar53 = 8;
      lVar45 = 9;
      lVar46 = 10;
      lVar50 = 0xb;
      lVar54 = 0xc;
      local_150 = 0xd;
      local_158 = 0xe;
      local_a0 = 0xf;
      local_a8 = 2;
      local_b0 = 1;
      for (uVar37 = 0; (long)(uVar37 | 0xf) < (long)uVar51; uVar37 = uVar37 + 0x10) {
        pauVar33 = (undefined1 (*) [64])
                   ((long)(this->weight_data_tm).w * (uVar37 >> 4) * (this->weight_data_tm).elemsize
                   + (long)(this->weight_data_tm).data);
        lVar59 = (long)local_cc;
        lVar56 = local_e8 * lVar27 * lVar59;
        lVar29 = local_e8 * lVar28 * lVar59;
        lVar32 = local_e8 * lVar30 * lVar59;
        lVar34 = local_e8 * lVar35 * lVar59;
        lVar36 = local_e8 * lVar31 * lVar59;
        lVar39 = local_e8 * lVar53 * lVar59;
        lVar42 = local_e8 * lVar45 * lVar59;
        lVar48 = local_e8 * lVar46 * lVar59;
        lVar44 = local_e8 * lVar50 * lVar59;
        lVar43 = local_e8 * lVar54 * lVar59;
        lVar38 = local_e8 * local_150 * lVar59;
        lVar49 = local_e8 * local_158 * lVar59;
        lVar47 = local_e8 * local_a0 * lVar59;
        lVar55 = local_e8 * local_a8 * lVar59;
        lVar58 = local_e8 * local_b0 * lVar59;
        lVar57 = local_e8 * uVar37 * lVar59;
        lVar41 = 0;
        pp_Var52 = pd._vptr_ParamDict;
        for (iVar24 = 0; iVar24 + 0xf < iVar25; iVar24 = iVar24 + 0x10) {
          auVar84 = *(undefined1 (*) [64])((long)pp_Var52 + lVar57);
          auVar85 = *(undefined1 (*) [64])((long)pp_Var52 + lVar58);
          auVar86 = *(undefined1 (*) [64])((long)pp_Var52 + lVar55);
          auVar87 = *(undefined1 (*) [64])((long)pp_Var52 + lVar56);
          auVar88 = *(undefined1 (*) [64])((long)pp_Var52 + lVar29);
          auVar89 = *(undefined1 (*) [64])((long)pp_Var52 + lVar32);
          auVar90 = *(undefined1 (*) [64])((long)pp_Var52 + lVar34);
          auVar91 = *(undefined1 (*) [64])((long)pp_Var52 + lVar36);
          auVar83 = *(undefined1 (*) [64])((long)pp_Var52 + lVar39);
          auVar92 = *(undefined1 (*) [64])((long)pp_Var52 + lVar42);
          auVar93 = *(undefined1 (*) [64])((long)pp_Var52 + lVar48);
          auVar94 = *(undefined1 (*) [64])((long)pp_Var52 + lVar44);
          auVar72 = *(undefined1 (*) [64])((long)pp_Var52 + lVar43);
          auVar73 = *(undefined1 (*) [64])((long)pp_Var52 + lVar38);
          auVar74 = *(undefined1 (*) [64])((long)pp_Var52 + lVar49);
          auVar75 = *(undefined1 (*) [64])((long)pp_Var52 + lVar47);
          auVar71 = vunpcklps_avx512f(auVar84,auVar85);
          auVar84 = vunpckhps_avx512f(auVar84,auVar85);
          auVar85 = vunpcklps_avx512f(auVar86,auVar87);
          auVar86 = vunpckhps_avx512f(auVar86,auVar87);
          auVar87 = vunpcklps_avx512f(auVar88,auVar89);
          auVar88 = vunpckhps_avx512f(auVar88,auVar89);
          auVar89 = vunpcklps_avx512f(auVar90,auVar91);
          auVar90 = vunpckhps_avx512f(auVar90,auVar91);
          auVar91 = vunpcklps_avx512f(auVar83,auVar92);
          auVar83 = vunpckhps_avx512f(auVar83,auVar92);
          auVar92 = vunpcklps_avx512f(auVar93,auVar94);
          auVar93 = vunpckhps_avx512f(auVar93,auVar94);
          auVar94 = vunpcklps_avx512f(auVar72,auVar73);
          auVar72 = vunpckhps_avx512f(auVar72,auVar73);
          auVar73 = vunpcklps_avx512f(auVar74,auVar75);
          auVar74 = vunpckhps_avx512f(auVar74,auVar75);
          auVar75 = vunpcklpd_avx512f(auVar71,auVar85);
          auVar85 = vunpckhpd_avx512f(auVar71,auVar85);
          auVar71 = vunpcklpd_avx512f(auVar84,auVar86);
          auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
          auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
          auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
          auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
          auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
          auVar90 = vunpcklpd_avx512f(auVar91,auVar92);
          auVar91 = vunpckhpd_avx512f(auVar91,auVar92);
          auVar92 = vunpcklpd_avx512f(auVar83,auVar93);
          auVar83 = vunpckhpd_avx512f(auVar83,auVar93);
          auVar93 = vunpcklpd_avx512f(auVar94,auVar73);
          auVar94 = vunpckhpd_avx512f(auVar94,auVar73);
          auVar73 = vunpcklpd_avx512f(auVar72,auVar74);
          auVar72 = vunpckhpd_avx512f(auVar72,auVar74);
          auVar74 = vshuff64x2_avx512f(auVar75,auVar86,0x88);
          auVar76 = vshuff64x2_avx512f(auVar90,auVar93,0x88);
          auVar77 = vshuff64x2_avx512f(auVar85,auVar87,0x88);
          auVar78 = vshuff64x2_avx512f(auVar91,auVar94,0x88);
          auVar79 = vshuff64x2_avx512f(auVar71,auVar89,0x88);
          auVar80 = vshuff64x2_avx512f(auVar92,auVar73,0x88);
          auVar81 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
          auVar82 = vshuff64x2_avx512f(auVar83,auVar72,0x88);
          auVar86 = vshuff64x2_avx512f(auVar75,auVar86,0xdd);
          auVar90 = vshuff64x2_avx512f(auVar90,auVar93,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar85,auVar87,0xdd);
          auVar87 = vshuff64x2_avx512f(auVar91,auVar94,0xdd);
          auVar89 = vshuff64x2_avx512f(auVar71,auVar89,0xdd);
          auVar91 = vshuff64x2_avx512f(auVar92,auVar73,0xdd);
          auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
          auVar88 = vshuff64x2_avx512f(auVar83,auVar72,0xdd);
          auVar83 = vshuff64x2_avx512f(auVar74,auVar76,0x88);
          auVar92 = vshuff64x2_avx512f(auVar77,auVar78,0x88);
          auVar93 = vshuff64x2_avx512f(auVar79,auVar80,0x88);
          auVar94 = vshuff64x2_avx512f(auVar81,auVar82,0x88);
          auVar72 = vshuff64x2_avx512f(auVar86,auVar90,0x88);
          auVar73 = vshuff64x2_avx512f(auVar85,auVar87,0x88);
          auVar75 = vshuff64x2_avx512f(auVar89,auVar91,0x88);
          auVar71 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
          auVar74 = vshuff64x2_avx512f(auVar74,auVar76,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar77,auVar78,0xdd);
          auVar77 = vshuff64x2_avx512f(auVar79,auVar80,0xdd);
          auVar78 = vshuff64x2_avx512f(auVar81,auVar82,0xdd);
          auVar86 = vshuff64x2_avx512f(auVar86,auVar90,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar85,auVar87,0xdd);
          auVar87 = vshuff64x2_avx512f(auVar89,auVar91,0xdd);
          auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
          *pauVar33 = auVar83;
          pauVar33[1] = auVar92;
          pauVar33[2] = auVar93;
          pauVar33[3] = auVar94;
          pauVar33[4] = auVar72;
          pauVar33[5] = auVar73;
          pauVar33[6] = auVar75;
          pauVar33[7] = auVar71;
          pauVar33[8] = auVar74;
          pauVar33[9] = auVar76;
          pauVar33[10] = auVar77;
          pauVar33[0xb] = auVar78;
          pauVar33[0xc] = auVar86;
          pauVar33[0xd] = auVar85;
          pauVar33[0xe] = auVar87;
          pauVar33[0xf] = auVar84;
          pauVar33 = pauVar33 + 0x10;
          pp_Var52 = pp_Var52 + 8;
          lVar41 = lVar41 + 0x10;
        }
        for (; iVar24 + 7 < iVar25; iVar24 = iVar24 + 8) {
          auVar7 = *(undefined1 (*) [32])((long)pp_Var52 + lVar57);
          auVar8 = *(undefined1 (*) [32])((long)pp_Var52 + lVar58);
          auVar9 = *(undefined1 (*) [32])((long)pp_Var52 + lVar55);
          auVar10 = *(undefined1 (*) [32])((long)pp_Var52 + lVar56);
          auVar11 = *(undefined1 (*) [32])((long)pp_Var52 + lVar29);
          auVar12 = *(undefined1 (*) [32])((long)pp_Var52 + lVar32);
          auVar13 = *(undefined1 (*) [32])((long)pp_Var52 + lVar34);
          auVar14 = *(undefined1 (*) [32])((long)pp_Var52 + lVar36);
          auVar22 = *(undefined1 (*) [32])((long)pp_Var52 + lVar39);
          auVar70 = *(undefined1 (*) [32])((long)pp_Var52 + lVar42);
          auVar95 = *(undefined1 (*) [32])((long)pp_Var52 + lVar48);
          auVar96 = *(undefined1 (*) [32])((long)pp_Var52 + lVar44);
          auVar97 = *(undefined1 (*) [32])((long)pp_Var52 + lVar43);
          auVar6 = *(undefined1 (*) [32])((long)pp_Var52 + lVar38);
          auVar61 = *(undefined1 (*) [32])((long)pp_Var52 + lVar49);
          auVar62 = *(undefined1 (*) [32])((long)pp_Var52 + lVar47);
          auVar60 = vunpcklps_avx512vl(auVar7,auVar8);
          auVar7 = vunpckhps_avx(auVar7,auVar8);
          auVar63 = vunpcklps_avx(auVar9,auVar10);
          auVar8 = vunpckhps_avx(auVar9,auVar10);
          auVar64 = vunpcklps_avx(auVar11,auVar12);
          auVar9 = vunpckhps_avx(auVar11,auVar12);
          auVar65 = vunpcklps_avx(auVar13,auVar14);
          auVar10 = vunpckhps_avx(auVar13,auVar14);
          auVar66 = vunpcklps_avx(auVar22,auVar70);
          auVar11 = vunpckhps_avx(auVar22,auVar70);
          auVar67 = vunpcklps_avx(auVar95,auVar96);
          auVar12 = vunpckhps_avx(auVar95,auVar96);
          auVar68 = vunpcklps_avx(auVar97,auVar6);
          auVar13 = vunpckhps_avx(auVar97,auVar6);
          auVar6 = vunpcklps_avx(auVar61,auVar62);
          auVar14 = vunpckhps_avx(auVar61,auVar62);
          auVar61 = vunpcklpd_avx512vl(auVar60,auVar63);
          auVar62 = vunpckhpd_avx512vl(auVar60,auVar63);
          auVar63 = vunpcklpd_avx512vl(auVar7,auVar8);
          auVar7 = vunpckhpd_avx(auVar7,auVar8);
          auVar22 = vunpcklpd_avx(auVar64,auVar65);
          auVar8 = vunpckhpd_avx(auVar64,auVar65);
          auVar70 = vunpcklpd_avx(auVar9,auVar10);
          auVar9 = vunpckhpd_avx(auVar9,auVar10);
          auVar95 = vunpcklpd_avx(auVar66,auVar67);
          auVar10 = vunpckhpd_avx(auVar66,auVar67);
          auVar96 = vunpcklpd_avx(auVar11,auVar12);
          auVar11 = vunpckhpd_avx(auVar11,auVar12);
          auVar97 = vunpcklpd_avx(auVar68,auVar6);
          auVar12 = vunpckhpd_avx(auVar68,auVar6);
          auVar6 = vunpcklpd_avx(auVar13,auVar14);
          auVar13 = vunpckhpd_avx(auVar13,auVar14);
          auVar98._16_16_ = auVar22._0_16_;
          auVar98._0_16_ = auVar61._0_16_;
          auVar64 = vinsertf32x4_avx512vl(auVar95,auVar97._0_16_,1);
          auVar65 = vinsertf32x4_avx512vl(auVar62,auVar8._0_16_,1);
          auVar66 = vinsertf32x4_avx512vl(auVar10,auVar12._0_16_,1);
          auVar67 = vinsertf32x4_avx512vl(auVar63,auVar70._0_16_,1);
          auVar68 = vinsertf32x4_avx512vl(auVar96,auVar6._0_16_,1);
          auVar60 = vinsertf32x4_avx512vl(auVar7,auVar9._0_16_,1);
          auVar69 = vinsertf32x4_avx512vl(auVar11,auVar13._0_16_,1);
          auVar14 = vperm2f128_avx(auVar61,auVar22,0x31);
          auVar22 = vperm2f128_avx(auVar95,auVar97,0x31);
          auVar8 = vperm2f128_avx(auVar62,auVar8,0x31);
          auVar10 = vperm2f128_avx(auVar10,auVar12,0x31);
          auVar70 = vshuff64x2_avx512vl(auVar63,auVar70,3);
          auVar12 = vperm2f128_avx(auVar96,auVar6,0x31);
          auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
          auVar9 = vperm2f128_avx(auVar11,auVar13,0x31);
          *(undefined1 (*) [32])*pauVar33 = auVar98;
          *(undefined1 (*) [32])((long)*pauVar33 + 0x20) = auVar64;
          *(undefined1 (*) [32])pauVar33[1] = auVar65;
          *(undefined1 (*) [32])(pauVar33[1] + 0x20) = auVar66;
          *(undefined1 (*) [32])pauVar33[2] = auVar67;
          *(undefined1 (*) [32])(pauVar33[2] + 0x20) = auVar68;
          *(undefined1 (*) [32])pauVar33[3] = auVar60;
          *(undefined1 (*) [32])(pauVar33[3] + 0x20) = auVar69;
          *(undefined1 (*) [32])pauVar33[4] = auVar14;
          *(undefined1 (*) [32])(pauVar33[4] + 0x20) = auVar22;
          *(undefined1 (*) [32])pauVar33[5] = auVar8;
          *(undefined1 (*) [32])(pauVar33[5] + 0x20) = auVar10;
          *(undefined1 (*) [32])pauVar33[6] = auVar70;
          *(undefined1 (*) [32])(pauVar33[6] + 0x20) = auVar12;
          *(undefined1 (*) [32])pauVar33[7] = auVar7;
          *(undefined1 (*) [32])(pauVar33[7] + 0x20) = auVar9;
          pauVar33 = pauVar33 + 8;
          pp_Var52 = pp_Var52 + 4;
          lVar41 = lVar41 + 8;
        }
        lVar59 = local_e8 * lVar59;
        for (; (int)lVar41 < iVar25; lVar41 = lVar41 + 1) {
          puVar40 = (undefined4 *)((long)pd._vptr_ParamDict + lVar41 * 4 + lVar59 * uVar37);
          *(undefined4 *)*pauVar33 = *puVar40;
          *(undefined4 *)((long)*pauVar33 + 4) = *(undefined4 *)((long)puVar40 + lVar59);
          *(undefined4 *)((long)*pauVar33 + 8) = *(undefined4 *)((long)puVar40 + lVar59 * 2);
          *(undefined4 *)((long)*pauVar33 + 0xc) = *(undefined4 *)((long)puVar40 + lVar59 * 3);
          *(undefined4 *)((long)*pauVar33 + 0x10) = puVar40[lVar59];
          *(undefined4 *)((long)*pauVar33 + 0x14) = *(undefined4 *)((long)puVar40 + lVar59 * 5);
          *(undefined4 *)((long)*pauVar33 + 0x18) = *(undefined4 *)((long)puVar40 + lVar59 * 6);
          *(undefined4 *)((long)*pauVar33 + 0x1c) = *(undefined4 *)((long)puVar40 + lVar59 * 7);
          *(undefined4 *)((long)*pauVar33 + 0x20) = puVar40[lVar59 * 2];
          *(undefined4 *)((long)*pauVar33 + 0x24) = *(undefined4 *)((long)puVar40 + lVar59 * 9);
          *(undefined4 *)((long)*pauVar33 + 0x28) = *(undefined4 *)((long)puVar40 + lVar59 * 10);
          *(undefined4 *)((long)*pauVar33 + 0x2c) = *(undefined4 *)((long)puVar40 + lVar59 * 0xb);
          *(undefined4 *)((long)*pauVar33 + 0x30) = puVar40[lVar59 * 3];
          *(undefined4 *)((long)*pauVar33 + 0x34) = *(undefined4 *)((long)puVar40 + lVar59 * 0xd);
          *(undefined4 *)((long)*pauVar33 + 0x38) = *(undefined4 *)((long)puVar40 + lVar59 * 0xe);
          *(undefined4 *)((long)*pauVar33 + 0x3c) = *(undefined4 *)((long)puVar40 + lVar59 * 0xf);
          pauVar33 = pauVar33 + 1;
        }
        lVar27 = lVar27 + 0x10;
        lVar28 = lVar28 + 0x10;
        lVar30 = lVar30 + 0x10;
        lVar35 = lVar35 + 0x10;
        lVar31 = lVar31 + 0x10;
        lVar53 = lVar53 + 0x10;
        lVar45 = lVar45 + 0x10;
        lVar46 = lVar46 + 0x10;
        lVar50 = lVar50 + 0x10;
        lVar54 = lVar54 + 0x10;
        local_150 = local_150 + 0x10;
        local_158 = local_158 + 0x10;
        local_a0 = local_a0 + 0x10;
        local_a8 = local_a8 + 0x10;
        local_b0 = local_b0 + 0x10;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0028f3bd;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_0028f3bd;
      if (local_d8 != (Allocator *)0x0) {
        (*local_d8->_vptr_Allocator[3])();
        goto LAB_0028f3bd;
      }
    }
    else if ((_h & 7) == 0) {
      Mat::reshape((Mat *)&pd,this_00,iVar25,_h,(Allocator *)0x0);
      Mat::create(this_01,iVar25,(int)_h >> 3,0x20,8,(Allocator *)0x0);
      lVar27 = 1;
      lVar28 = 2;
      lVar30 = 3;
      lVar35 = 4;
      lVar31 = 5;
      lVar53 = 6;
      lVar45 = 7;
      lVar46 = 0;
      for (uVar37 = 0; (long)(uVar37 | 7) < (long)uVar51; uVar37 = uVar37 + 8) {
        pvVar16 = (this->weight_data_tm).data;
        sVar18 = (this->weight_data_tm).elemsize;
        lVar54 = (long)(this->weight_data_tm).w;
        puVar40 = (undefined4 *)((uVar37 >> 3) * lVar54 * sVar18 + (long)pvVar16);
        lVar48 = (long)local_cc;
        lVar54 = sVar18 * lVar46 * lVar54;
        lVar50 = local_e8 * uVar37 * lVar48;
        lVar59 = local_e8 * lVar27 * lVar48;
        lVar29 = local_e8 * lVar28 * lVar48;
        lVar34 = local_e8 * lVar30 * lVar48;
        lVar36 = local_e8 * lVar35 * lVar48;
        lVar39 = local_e8 * lVar31 * lVar48;
        lVar42 = local_e8 * lVar53 * lVar48;
        lVar44 = local_e8 * lVar45 * lVar48;
        lVar32 = 0;
        lVar49 = 0;
        for (iVar24 = 0; iVar24 + 0xf < iVar25; iVar24 = iVar24 + 0x10) {
          auVar84 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar50);
          auVar85 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar59);
          auVar86 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar29);
          auVar87 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar34);
          auVar88 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar36);
          auVar89 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar39);
          auVar90 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar42);
          auVar91 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar49 + lVar44);
          auVar83 = vunpcklps_avx512f(auVar84,auVar85);
          auVar84 = vunpckhps_avx512f(auVar84,auVar85);
          auVar85 = vunpcklps_avx512f(auVar86,auVar87);
          auVar86 = vunpckhps_avx512f(auVar86,auVar87);
          auVar87 = vunpcklps_avx512f(auVar88,auVar89);
          auVar88 = vunpckhps_avx512f(auVar88,auVar89);
          auVar89 = vunpcklps_avx512f(auVar90,auVar91);
          auVar90 = vunpckhps_avx512f(auVar90,auVar91);
          auVar91 = vunpcklpd_avx512f(auVar83,auVar85);
          auVar85 = vunpckhpd_avx512f(auVar83,auVar85);
          auVar83 = vunpcklpd_avx512f(auVar84,auVar86);
          auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
          auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
          auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
          auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
          auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
          auVar90 = vshuff64x2_avx512f(auVar91,auVar86,0x88);
          auVar92 = vshuff64x2_avx512f(auVar85,auVar87,0x88);
          auVar93 = vshuff64x2_avx512f(auVar83,auVar89,0x88);
          auVar94 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
          auVar86 = vshuff64x2_avx512f(auVar91,auVar86,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar85,auVar87,0xdd);
          auVar87 = vshuff64x2_avx512f(auVar83,auVar89,0xdd);
          auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
          auVar88 = vshuff64x2_avx512f(auVar90,auVar92,0x88);
          auVar89 = vshuff64x2_avx512f(auVar93,auVar94,0x88);
          auVar91 = vshuff64x2_avx512f(auVar86,auVar85,0x88);
          auVar83 = vshuff64x2_avx512f(auVar87,auVar84,0x88);
          auVar90 = vshuff64x2_avx512f(auVar90,auVar92,0xdd);
          auVar92 = vshuff64x2_avx512f(auVar93,auVar94,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar86,auVar85,0xdd);
          auVar84 = vshuff64x2_avx512f(auVar87,auVar84,0xdd);
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54) = auVar88;
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x40) = auVar89;
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x80) = auVar91;
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54 + 0xc0) = auVar83;
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x100) = auVar90;
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x140) = auVar92;
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x180) = auVar85;
          *(undefined1 (*) [64])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x1c0) = auVar84;
          puVar40 = puVar40 + 0x80;
          lVar49 = lVar49 + 0x40;
          lVar32 = lVar32 + 0x10;
        }
        for (; iVar24 + 7 < iVar25; iVar24 = iVar24 + 8) {
          auVar7 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar50);
          auVar8 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar59);
          auVar9 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar29);
          auVar10 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar34);
          auVar11 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar36);
          auVar12 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar39);
          auVar13 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar42);
          auVar14 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar49 + lVar44);
          auVar22 = vunpcklps_avx(auVar7,auVar8);
          auVar8 = vunpckhps_avx(auVar7,auVar8);
          auVar7 = vunpcklps_avx(auVar9,auVar10);
          auVar9 = vunpckhps_avx(auVar9,auVar10);
          auVar70 = vunpcklps_avx(auVar11,auVar12);
          auVar10 = vunpckhps_avx(auVar11,auVar12);
          auVar95 = vunpcklps_avx(auVar13,auVar14);
          auVar11 = vunpckhps_avx(auVar13,auVar14);
          auVar12 = vunpcklpd_avx(auVar22,auVar7);
          auVar7 = vunpckhpd_avx(auVar22,auVar7);
          auVar13 = vunpcklpd_avx(auVar8,auVar9);
          auVar8 = vunpckhpd_avx(auVar8,auVar9);
          auVar14 = vunpcklpd_avx(auVar70,auVar95);
          auVar9 = vunpckhpd_avx(auVar70,auVar95);
          auVar22 = vunpcklpd_avx(auVar10,auVar11);
          auVar10 = vunpckhpd_avx(auVar10,auVar11);
          auVar70._16_16_ = auVar14._0_16_;
          auVar70._0_16_ = auVar12._0_16_;
          auVar95._16_16_ = auVar9._0_16_;
          auVar95._0_16_ = auVar7._0_16_;
          auVar96._16_16_ = auVar22._0_16_;
          auVar96._0_16_ = auVar13._0_16_;
          auVar97._16_16_ = auVar10._0_16_;
          auVar97._0_16_ = auVar8._0_16_;
          auVar11 = vperm2f128_avx(auVar12,auVar14,0x31);
          auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
          auVar9 = vperm2f128_avx(auVar13,auVar22,0x31);
          auVar8 = vperm2f128_avx(auVar8,auVar10,0x31);
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54) = auVar70;
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x20) = auVar95;
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x40) = auVar96;
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x60) = auVar97;
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54 + 0x80) = auVar11;
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54 + 0xa0) = auVar7;
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54 + 0xc0) = auVar9;
          *(undefined1 (*) [32])((long)pvVar16 + lVar49 * 8 + lVar54 + 0xe0) = auVar8;
          puVar40 = puVar40 + 0x40;
          lVar49 = lVar49 + 0x20;
          lVar32 = lVar32 + 8;
        }
        lVar48 = local_e8 * lVar48;
        for (; (int)lVar32 < iVar25; lVar32 = lVar32 + 1) {
          puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar32 * 4 + lVar48 * uVar37);
          *puVar40 = *puVar1;
          puVar40[1] = *(undefined4 *)((long)puVar1 + lVar48);
          puVar40[2] = *(undefined4 *)((long)puVar1 + lVar48 * 2);
          puVar40[3] = *(undefined4 *)((long)puVar1 + lVar48 * 3);
          puVar40[4] = puVar1[lVar48];
          puVar40[5] = *(undefined4 *)((long)puVar1 + lVar48 * 5);
          puVar40[6] = *(undefined4 *)((long)puVar1 + lVar48 * 6);
          puVar40[7] = *(undefined4 *)((long)puVar1 + lVar48 * 7);
          puVar40 = puVar40 + 8;
        }
        lVar46 = lVar46 + 1;
        lVar27 = lVar27 + 8;
        lVar28 = lVar28 + 8;
        lVar30 = lVar30 + 8;
        lVar35 = lVar35 + 8;
        lVar31 = lVar31 + 8;
        lVar53 = lVar53 + 8;
        lVar45 = lVar45 + 8;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0028f3bd;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_0028f3bd;
      if (local_d8 != (Allocator *)0x0) {
        (*local_d8->_vptr_Allocator[3])();
        goto LAB_0028f3bd;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_0028e34a;
      Mat::reshape((Mat *)&pd,this_00,iVar25,_h,(Allocator *)0x0);
      Mat::create(this_01,iVar25,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      lVar27 = 1;
      lVar28 = 2;
      lVar30 = 3;
      lVar35 = 0;
      for (uVar37 = 0; (long)(uVar37 | 3) < (long)uVar51; uVar37 = uVar37 + 4) {
        lVar45 = (long)(this->weight_data_tm).w;
        pvVar16 = (this->weight_data_tm).data;
        sVar18 = (this->weight_data_tm).elemsize;
        puVar40 = (undefined4 *)((uVar37 >> 2) * lVar45 * sVar18 + (long)pvVar16);
        lVar53 = (long)local_cc;
        lVar45 = sVar18 * lVar35 * lVar45;
        lVar46 = local_e8 * uVar37 * lVar53;
        lVar50 = local_e8 * lVar27 * lVar53;
        lVar31 = local_e8 * lVar28 * lVar53;
        lVar53 = local_e8 * lVar30 * lVar53;
        lVar59 = 0;
        lVar54 = 0;
        for (iVar24 = 0; iVar24 + 3 < iVar25; iVar24 = iVar24 + 4) {
          auVar2 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar46);
          auVar3 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar50);
          auVar4 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar31);
          auVar5 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar53);
          auVar20 = vunpcklps_avx(auVar2,auVar3);
          auVar21 = vunpcklps_avx(auVar4,auVar5);
          auVar19 = vunpckhps_avx(auVar2,auVar3);
          auVar5 = vunpckhps_avx(auVar4,auVar5);
          auVar2 = vmovlhps_avx(auVar20,auVar21);
          auVar4 = vunpckhpd_avx(auVar20,auVar21);
          auVar3 = vmovlhps_avx(auVar19,auVar5);
          auVar5 = vunpckhpd_avx(auVar19,auVar5);
          *(undefined1 (*) [16])((long)pvVar16 + lVar54 * 4 + lVar45) = auVar2;
          *(undefined1 (*) [16])((long)pvVar16 + lVar54 * 4 + lVar45 + 0x10) = auVar4;
          *(undefined1 (*) [16])((long)pvVar16 + lVar54 * 4 + lVar45 + 0x20) = auVar3;
          *(undefined1 (*) [16])((long)pvVar16 + lVar54 * 4 + lVar45 + 0x30) = auVar5;
          puVar40 = puVar40 + 0x10;
          lVar54 = lVar54 + 0x10;
          lVar59 = lVar59 + 4;
        }
        for (; (int)lVar59 < iVar25; lVar59 = lVar59 + 1) {
          *puVar40 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar59 * 4 + lVar46);
          puVar40[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar59 * 4 + lVar50);
          puVar40[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar59 * 4 + lVar31);
          puVar40[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar59 * 4 + lVar53);
          puVar40 = puVar40 + 4;
        }
        lVar35 = lVar35 + 1;
        lVar27 = lVar27 + 4;
        lVar28 = lVar28 + 4;
        lVar30 = lVar30 + 4;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0028f3bd;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_0028f3bd;
      if (local_d8 != (Allocator *)0x0) {
        (*local_d8->_vptr_Allocator[3])();
        goto LAB_0028f3bd;
      }
    }
    free(pd._vptr_ParamDict);
  }
  else {
LAB_0028e34a:
    piVar15 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    piVar15 = (this->weight_data_tm).refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar16 = (this->weight_data_tm).data;
        pAVar17 = (this->weight_data_tm).allocator;
        if (pAVar17 == (Allocator *)0x0) {
          free(pvVar16);
        }
        else {
          (*pAVar17->_vptr_Allocator[3])(pAVar17,pvVar16,(long)iVar24 % (long)(int)_h & 0xffffffff);
        }
      }
    }
    piVar15 = (this->super_InnerProduct).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
    (this->weight_data_tm).refcount = piVar15;
    (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
    iVar24 = (this->super_InnerProduct).weight_data.w;
    iVar25 = (this->super_InnerProduct).weight_data.h;
    iVar23 = (this->super_InnerProduct).weight_data.d;
    (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
    (this->weight_data_tm).w = iVar24;
    (this->weight_data_tm).h = iVar25;
    (this->weight_data_tm).d = iVar23;
    (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
  }
LAB_0028f3bd:
  if (opt->lightmode == true) {
    piVar15 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pAVar17 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar17 == (Allocator *)0x0) {
          free((this->super_InnerProduct).weight_data.data);
        }
        else {
          (*pAVar17->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}